

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O1

void tool_help(void)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    puts(*(char **)((long)helptext + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x4c0);
  return;
}

Assistant:

void tool_help(void)
{
  int i;
  for(i = 0; helptext[i]; i++) {
    puts(helptext[i]);
#ifdef PRINT_LINES_PAUSE
    if(i && ((i % PRINT_LINES_PAUSE) == 0))
      tool_pressanykey();
#endif
  }
}